

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topojson.cc
# Opt level: O3

void __thiscall topojson_t::make_coordinates(topojson_t *this,size_t topology_index)

{
  long *plVar1;
  pointer __x;
  pointer pGVar2;
  pointer paVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  iterator iVar7;
  int iVar8;
  undefined8 uVar9;
  long lVar10;
  pointer ptVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  char *pcVar16;
  char *extraout_RDX;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  vector<double,_std::allocator<double>_> xp;
  vector<double,_std::allocator<double>_> yp;
  Geometry_t geometry;
  Polygon_topojson_t polygon;
  arc_t arc;
  void *local_178;
  iterator iStack_170;
  double *local_168;
  void *local_158;
  iterator iStack_150;
  double *local_148;
  long local_140;
  uint local_134;
  char *local_130;
  pointer local_128;
  pointer local_120;
  long *local_118 [2];
  long local_108 [2];
  vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_b0;
  double local_98;
  double adStack_90 [2];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_80;
  char *local_68;
  char *local_60;
  ulong local_58;
  ulong local_50;
  double local_48;
  double dStack_40;
  
  ptVar11 = (this->m_topology).
            super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar12 = ((long)(this->m_topology).
                  super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ptVar11 >> 3) * 0x6db6db6db6db6db7;
  pcVar19 = (char *)topology_index;
  if (uVar12 < topology_index || uVar12 - topology_index == 0) {
LAB_0010633b:
    uVar9 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       pcVar19);
    if (local_118[0] != local_108) {
      operator_delete(local_118[0],local_108[0] + 1);
    }
    _Unwind_Resume(uVar9);
  }
  pGVar2 = *(pointer *)
            ((long)&ptVar11[topology_index].m_geom.
                    super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_> + 8);
  lVar10 = *(long *)&ptVar11[topology_index].m_geom.
                     super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>;
  this->idx_geom = 0;
  lVar10 = (long)pGVar2 - lVar10;
  if (lVar10 != 0) {
    local_68 = (char *)((lVar10 >> 3) * 0x6db6db6db6db6db7);
    pcVar17 = (char *)0x0;
    pcVar14 = (char *)topology_index;
    local_130 = (char *)topology_index;
    do {
      ptVar11 = (this->m_topology).
                super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar13 = (char *)(((long)(this->m_topology).
                                super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar11 >> 3) *
                        0x6db6db6db6db6db7);
      pcVar19 = pcVar14;
      if ((pcVar13 < pcVar14 || (long)pcVar13 - (long)pcVar14 == 0) ||
         (lVar10 = *(long *)&ptVar11[topology_index].m_geom.
                             super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>,
         pcVar13 = (char *)(((long)*(pointer *)
                                    ((long)&ptVar11[topology_index].m_geom.
                                            super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>
                                    + 8) - lVar10 >> 3) * 0x6db6db6db6db6db7), pcVar19 = pcVar17,
         pcVar13 < pcVar17 || (long)pcVar13 - (long)pcVar17 == 0)) goto LAB_0010633b;
      local_118[0] = local_108;
      plVar1 = (long *)(lVar10 + (long)pcVar17 * 0x38);
      std::__cxx11::string::_M_construct<char*>((string *)local_118,*plVar1,plVar1[1] + *plVar1);
      std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::vector
                (&local_f8,
                 (vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_> *)(plVar1 + 4));
      iVar8 = std::__cxx11::string::compare((char *)local_118);
      if (((iVar8 == 0) ||
          (iVar8 = std::__cxx11::string::compare((char *)local_118), pcVar19 = pcVar14, iVar8 == 0))
         && (pcVar19 = pcVar14,
            (long)local_f8.
                  super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_f8.
                  super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0)) {
        lVar10 = ((long)local_f8.
                        super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_f8.
                        super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
        local_60 = (char *)(lVar10 + (ulong)(lVar10 == 0));
        pcVar17 = (char *)0x0;
        do {
          pcVar14 = (char *)(((long)local_f8.
                                    super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_f8.
                                    super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x71c71c71c71c71c7);
          if (pcVar14 < pcVar17 || (long)pcVar14 - (long)pcVar17 == 0) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       pcVar17);
            goto LAB_0010633b;
          }
          __x = local_f8.super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)pcVar17;
          std::vector<int,_std::allocator<int>_>::vector(&local_e0,&__x->arcs);
          std::vector<double,_std::allocator<double>_>::vector(&local_c8,&__x->m_x);
          std::vector<double,_std::allocator<double>_>::vector(&local_b0,&__x->m_y);
          if ((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar10 = (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            local_58 = lVar10 + (ulong)(lVar10 == 0);
            uVar12 = 0;
            do {
              if ((ulong)((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2) <= uVar12) goto LAB_001062e7;
              local_134 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar12];
              uVar18 = (ulong)(int)((int)local_134 >> 0x1f ^ local_134);
              paVar3 = (this->m_arcs).super__Vector_base<arc_t,_std::allocator<arc_t>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar15 = ((long)(this->m_arcs).super__Vector_base<arc_t,_std::allocator<arc_t>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)paVar3 >> 3) *
                       -0x5555555555555555;
              if (uVar15 < uVar18 || uVar15 - uVar18 == 0) goto LAB_001062d9;
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::vector(&local_80,&paVar3[uVar18].vec);
              local_140 = ((long)local_80.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_80.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555;
              local_168 = (double *)0x0;
              local_178 = (void *)0x0;
              iStack_170._M_current = (double *)0x0;
              local_148 = (double *)0x0;
              local_158 = (void *)0x0;
              iStack_150._M_current = (double *)0x0;
              local_50 = uVar12;
              if (local_80.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_80.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                local_128 = local_80.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                local_120 = local_80.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                uVar15 = local_140 + (ulong)(local_140 == 0);
                local_48 = 0.0;
                dStack_40 = 0.0;
                lVar10 = 8;
                uVar12 = 0;
                do {
                  uVar18 = ((long)local_80.
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_80.
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555;
                  if (uVar18 < uVar12 || uVar18 - uVar12 == 0) {
LAB_0010626e:
                    pcVar13 = 
                    "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
                    pcVar14 = (char *)std::__throw_out_of_range_fmt
                                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                                 ,uVar12);
                    goto LAB_0010629b;
                  }
                  pdVar4 = *(double **)
                            ((long)local_80.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8);
                  pdVar5 = *(double **)
                            ((long)&((local_80.
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data._M_start + lVar10);
                  if (pdVar5 == pdVar4) {
                    uVar12 = 0;
                    goto LAB_0010626e;
                  }
                  local_98 = *pdVar4;
                  if ((ulong)((long)pdVar5 - (long)pdVar4 >> 3) < 2) {
                    uVar12 = 1;
                    goto LAB_0010626e;
                  }
                  local_48 = local_48 + local_98;
                  dStack_40 = dStack_40 + pdVar4[1];
                  local_98 = this->scale[0] * local_48 + this->translate[0];
                  adStack_90[0] = this->scale[1] * dStack_40 + this->translate[1];
                  if (iStack_170._M_current == local_168) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                              ((vector<double,std::allocator<double>> *)&local_178,iStack_170,
                               &local_98);
                  }
                  else {
                    *iStack_170._M_current = local_98;
                    iStack_170._M_current = iStack_170._M_current + 1;
                  }
                  if (iStack_150._M_current == local_148) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                              ((vector<double,std::allocator<double>> *)&local_158,iStack_150,
                               adStack_90);
                  }
                  else {
                    *iStack_150._M_current = adStack_90[0];
                    iStack_150._M_current = iStack_150._M_current + 1;
                  }
                  pcVar19 = local_130;
                  uVar12 = uVar12 + 1;
                  lVar10 = lVar10 + 0x18;
                } while (uVar15 != uVar12);
                if ((int)local_134 < 0) {
                  if (local_128 != local_120) {
                    uVar12 = local_140 * 8;
                    do {
                      uVar12 = uVar12 - 8;
                      ptVar11 = (this->m_topology).
                                super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      pcVar16 = (char *)(((long)(this->m_topology).
                                                super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)ptVar11 >> 3) * 0x6db6db6db6db6db7);
                      pcVar13 = pcVar16;
                      pcVar14 = pcVar19;
                      if (pcVar16 < pcVar19 || (long)pcVar16 - (long)pcVar19 == 0)
                      goto LAB_001062c8;
                      pcVar14 = (char *)this->idx_geom;
                      lVar10 = *(long *)&ptVar11[topology_index].m_geom.
                                         super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>
                      ;
                      pcVar13 = (char *)(((long)*(pointer *)
                                                 ((long)&ptVar11[topology_index].m_geom.
                                                                                                                  
                                                  super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>
                                                 + 8) - lVar10 >> 3) * 0x6db6db6db6db6db7);
                      if (pcVar13 < pcVar14 || (long)pcVar13 - (long)pcVar14 == 0)
                      goto LAB_001062c8;
                      lVar6 = *(long *)(lVar10 + 0x20 + (long)pcVar14 * 0x38);
                      pcVar13 = (char *)((*(long *)(lVar10 + 0x28 + (long)pcVar14 * 0x38) - lVar6 >>
                                         3) * -0x71c71c71c71c71c7);
                      pcVar14 = pcVar17;
                      if (pcVar13 < pcVar17 || (long)pcVar13 - (long)pcVar17 == 0)
                      goto LAB_001062c8;
                      lVar6 = lVar6 + (long)pcVar17 * 0x48;
                      iVar7._M_current = *(double **)(lVar6 + 0x20);
                      if (iVar7._M_current == *(double **)(lVar6 + 0x28)) {
                        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                  ((vector<double,std::allocator<double>> *)(lVar6 + 0x18),iVar7,
                                   (double *)((long)local_178 + uVar12));
                        ptVar11 = (this->m_topology).
                                  super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        pcVar13 = (char *)(((long)(this->m_topology).
                                                  super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)ptVar11 >> 3) * 0x6db6db6db6db6db7);
                      }
                      else {
                        *iVar7._M_current = *(double *)((long)local_178 + uVar12);
                        *(double **)(lVar6 + 0x20) = iVar7._M_current + 1;
                        pcVar13 = pcVar16;
                      }
                      pcVar14 = pcVar19;
                      if (pcVar13 <= pcVar19) goto LAB_001062c8;
                      pcVar14 = (char *)this->idx_geom;
                      lVar10 = *(long *)&ptVar11[topology_index].m_geom.
                                         super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>
                      ;
                      pcVar13 = (char *)(((long)*(pointer *)
                                                 ((long)&ptVar11[topology_index].m_geom.
                                                                                                                  
                                                  super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>
                                                 + 8) - lVar10 >> 3) * 0x6db6db6db6db6db7);
                      if (pcVar13 < pcVar14 || (long)pcVar13 - (long)pcVar14 == 0)
                      goto LAB_001062c8;
                      lVar6 = *(long *)(lVar10 + 0x20 + (long)pcVar14 * 0x38);
                      pcVar13 = (char *)((*(long *)(lVar10 + 0x28 + (long)pcVar14 * 0x38) - lVar6 >>
                                         3) * -0x71c71c71c71c71c7);
                      pcVar14 = pcVar17;
                      if (pcVar13 < pcVar17 || (long)pcVar13 - (long)pcVar17 == 0)
                      goto LAB_001062c8;
                      lVar6 = lVar6 + (long)pcVar17 * 0x48;
                      iVar7._M_current = *(double **)(lVar6 + 0x38);
                      if (iVar7._M_current == *(double **)(lVar6 + 0x40)) {
                        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                  ((vector<double,std::allocator<double>> *)(lVar6 + 0x30),iVar7,
                                   (double *)((long)local_158 + uVar12));
                      }
                      else {
                        *iVar7._M_current = *(double *)((long)local_158 + uVar12);
                        *(double **)(lVar6 + 0x38) = iVar7._M_current + 1;
                      }
                      uVar15 = uVar15 - 1;
                    } while (uVar15 != 0);
                  }
                }
                else if (local_128 != local_120) {
                  uVar12 = 0;
                  do {
                    ptVar11 = (this->m_topology).
                              super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pcVar16 = (char *)(((long)(this->m_topology).
                                              super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ptVar11 >> 3) * 0x6db6db6db6db6db7);
                    pcVar13 = pcVar16;
                    pcVar14 = pcVar19;
                    if (pcVar16 < pcVar19 || (long)pcVar16 - (long)pcVar19 == 0) goto LAB_0010629b;
                    pcVar14 = (char *)this->idx_geom;
                    lVar10 = *(long *)&ptVar11[topology_index].m_geom.
                                       super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>;
                    pcVar13 = (char *)(((long)*(pointer *)
                                               ((long)&ptVar11[topology_index].m_geom.
                                                                                                              
                                                  super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>
                                               + 8) - lVar10 >> 3) * 0x6db6db6db6db6db7);
                    if (pcVar13 < pcVar14 || (long)pcVar13 - (long)pcVar14 == 0) goto LAB_0010629b;
                    lVar6 = *(long *)(lVar10 + 0x20 + (long)pcVar14 * 0x38);
                    pcVar13 = (char *)((*(long *)(lVar10 + 0x28 + (long)pcVar14 * 0x38) - lVar6 >> 3
                                       ) * -0x71c71c71c71c71c7);
                    pcVar14 = pcVar17;
                    if (pcVar13 < pcVar17 || (long)pcVar13 - (long)pcVar17 == 0) goto LAB_0010629b;
                    lVar6 = lVar6 + (long)pcVar17 * 0x48;
                    iVar7._M_current = *(double **)(lVar6 + 0x20);
                    if (iVar7._M_current == *(double **)(lVar6 + 0x28)) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                ((vector<double,std::allocator<double>> *)(lVar6 + 0x18),iVar7,
                                 (double *)((long)local_178 + uVar12));
                      ptVar11 = (this->m_topology).
                                super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      pcVar13 = (char *)(((long)(this->m_topology).
                                                super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)ptVar11 >> 3) * 0x6db6db6db6db6db7);
                    }
                    else {
                      *iVar7._M_current = *(double *)((long)local_178 + uVar12);
                      *(double **)(lVar6 + 0x20) = iVar7._M_current + 1;
                      pcVar13 = pcVar16;
                    }
                    pcVar14 = pcVar19;
                    if (pcVar13 <= pcVar19) goto LAB_0010629b;
                    pcVar14 = (char *)this->idx_geom;
                    lVar10 = *(long *)&ptVar11[topology_index].m_geom.
                                       super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>;
                    pcVar13 = (char *)(((long)*(pointer *)
                                               ((long)&ptVar11[topology_index].m_geom.
                                                                                                              
                                                  super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>
                                               + 8) - lVar10 >> 3) * 0x6db6db6db6db6db7);
                    if (pcVar13 < pcVar14 || (long)pcVar13 - (long)pcVar14 == 0) goto LAB_0010629b;
                    lVar6 = *(long *)(lVar10 + 0x20 + (long)pcVar14 * 0x38);
                    pcVar13 = (char *)((*(long *)(lVar10 + 0x28 + (long)pcVar14 * 0x38) - lVar6 >> 3
                                       ) * -0x71c71c71c71c71c7);
                    pcVar14 = pcVar17;
                    if (pcVar13 < pcVar17 || (long)pcVar13 - (long)pcVar17 == 0) goto LAB_0010629b;
                    lVar6 = lVar6 + (long)pcVar17 * 0x48;
                    iVar7._M_current = *(double **)(lVar6 + 0x38);
                    if (iVar7._M_current == *(double **)(lVar6 + 0x40)) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                ((vector<double,std::allocator<double>> *)(lVar6 + 0x30),iVar7,
                                 (double *)((long)local_158 + uVar12));
                    }
                    else {
                      *iVar7._M_current = *(double *)((long)local_158 + uVar12);
                      *(double **)(lVar6 + 0x38) = iVar7._M_current + 1;
                    }
                    uVar12 = uVar12 + 8;
                    uVar15 = uVar15 - 1;
                  } while (uVar15 != 0);
                }
              }
              if ((long)iStack_170._M_current - (long)local_178 >> 3 != local_140)
              goto LAB_001062f8;
              if (local_158 != (void *)0x0) {
                operator_delete(local_158,(long)local_148 - (long)local_158);
              }
              uVar12 = local_50;
              if (local_178 != (void *)0x0) {
                operator_delete(local_178,(long)local_168 - (long)local_178);
              }
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector(&local_80);
              uVar12 = uVar12 + 1;
            } while (uVar12 != local_58);
          }
          if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_b0.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          pcVar17 = pcVar17 + 1;
        } while (pcVar17 != local_60);
      }
      std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::~vector(&local_f8);
      if (local_118[0] != local_108) {
        operator_delete(local_118[0],local_108[0] + 1);
      }
      pcVar17 = (char *)(this->idx_geom + 1);
      this->idx_geom = (size_t)pcVar17;
      pcVar14 = pcVar19;
    } while (pcVar17 < local_68);
  }
  return;
LAB_0010629b:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pcVar14,
             pcVar13);
  pcVar13 = extraout_RDX;
  pcVar14 = pcVar17;
LAB_001062c8:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pcVar14,
             pcVar13);
LAB_001062d9:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001062e7:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12);
LAB_001062f8:
  __assert_fail("xp.size() == size_vec_arcs",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/pedro-vicente[P]lib_topojson/topojson.cc"
                ,0x1fe,"void topojson_t::make_coordinates(size_t)");
}

Assistant:

void topojson_t::make_coordinates(size_t topology_index)
{
  size_t size_geom = m_topology.at(topology_index).m_geom.size();
  for (idx_geom = 0; idx_geom < size_geom; idx_geom++)
  {
    Geometry_t geometry = m_topology.at(topology_index).m_geom.at(idx_geom);
    if (geometry.type.compare("Polygon") == 0 || geometry.type.compare("MultiPolygon") == 0)
    {
      size_t size_pol = geometry.m_polygon.size();
      for (size_t idx_pol = 0; idx_pol < size_pol; idx_pol++)
      {
        Polygon_topojson_t polygon = geometry.m_polygon.at(idx_pol);
        size_t size_arcs = polygon.arcs.size();

        for (size_t idx_arc = 0; idx_arc < size_arcs; idx_arc++)
        {
          int index = polygon.arcs.at(idx_arc);
          int index_q = index < 0 ? ~index : index;
          arc_t arc = m_arcs.at(index_q);
          size_t size_vec_arcs = arc.vec.size();
          //if a topology is quantized, the positions of each arc in the topology which are quantized 
          //must be delta-encoded. The first position of the arc is a normal position [x1, y1]. 
          //The second position [x2, y2] is encoded as [dx2, dy2], where 
          //x2 = x1 + dx2 and 
          //y2 = y1 + dx2.
          //The third position [x3, y3] is encoded as [dx3, dy3], where 
          //x3 = x2 + dx3 = x1 + dx2 + dx3 and
          //y3 = y2 + dy3 = y1 + dy2 + dy3 and so on.
          double x = 0;
          double y = 0;
          //temporary positions
          std::vector<double> xp;
          std::vector<double> yp;
          for (size_t idx = 0; idx < size_vec_arcs; idx++)
          {
            double position[2];
            position[0] = arc.vec.at(idx).at(0);
            position[1] = arc.vec.at(idx).at(1);
            position[0] = (x += position[0]) * scale[0] + translate[0];
            position[1] = (y += position[1]) * scale[1] + translate[1];
            xp.push_back(position[0]);
            yp.push_back(position[1]);
          }//size_vec_arcs

          //@mbostock
          //TopoJSON allows you to reference a reversed arc in a geometry so that when geometries share an arc, 
          //but some geometries need the arc in the opposite direction, the geometries can reference the same arc.
          //This occurs very commonly when you have neighboring geometries.For example, California and Nevada 
          //share a border, but given that both would typically have the same winding order, 
          //the shared border must be reversed between the two polygons if you want to share the arc.
          //A reversed arc means that rather than the arc�s points going p_0, p_1, � p_n, 
          //the points go p_n, p_{ n - 1 }, � p_0.

           //reverse the subsequences of points represented by the negative arc indexes
          if (index < 0)
          {
            for (size_t idx = 0; idx < size_vec_arcs; idx++)
            {
              size_t jdx = size_vec_arcs - idx - 1;
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_x.push_back(xp[jdx]);
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_y.push_back(yp[jdx]);
            }
          }
          //do not reverse
          else
          {
            for (size_t idx = 0; idx < size_vec_arcs; idx++)
            {
              size_t jdx = idx;
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_x.push_back(xp[jdx]);
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_y.push_back(yp[jdx]);
            }
          }
          assert(xp.size() == size_vec_arcs);

        }//size_arcs
      }//size_pol
    }//"Polygon"
  }//size_geom
}